

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O0

void __thiscall Assimp::Ogre::Mesh::Reset(Mesh *this)

{
  Skeleton *this_00;
  VertexData *this_01;
  SubMesh *this_02;
  Animation *this_03;
  Pose *this_04;
  bool bVar1;
  reference ppSVar2;
  reference ppAVar3;
  reference ppPVar4;
  Pose **pose;
  iterator __end2_2;
  iterator __begin2_2;
  PoseList *__range2_2;
  Animation **anim;
  iterator __end2_1;
  iterator __begin2_1;
  AnimationList *__range2_1;
  SubMesh **mesh;
  iterator __end2;
  iterator __begin2;
  SubMeshList *__range2;
  Mesh *this_local;
  
  this_00 = this->skeleton;
  if (this_00 != (Skeleton *)0x0) {
    Skeleton::~Skeleton(this_00);
    operator_delete(this_00,0x38);
  }
  this->skeleton = (Skeleton *)0x0;
  this_01 = this->sharedVertexData;
  if (this_01 != (VertexData *)0x0) {
    VertexData::~VertexData(this_01);
    operator_delete(this_01,200);
  }
  this->sharedVertexData = (VertexData *)0x0;
  __end2 = std::vector<Assimp::Ogre::SubMesh_*,_std::allocator<Assimp::Ogre::SubMesh_*>_>::begin
                     (&this->subMeshes);
  mesh = (SubMesh **)
         std::vector<Assimp::Ogre::SubMesh_*,_std::allocator<Assimp::Ogre::SubMesh_*>_>::end
                   (&this->subMeshes);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<Assimp::Ogre::SubMesh_**,_std::vector<Assimp::Ogre::SubMesh_*,_std::allocator<Assimp::Ogre::SubMesh_*>_>_>
                                *)&mesh);
    if (!bVar1) break;
    ppSVar2 = __gnu_cxx::
              __normal_iterator<Assimp::Ogre::SubMesh_**,_std::vector<Assimp::Ogre::SubMesh_*,_std::allocator<Assimp::Ogre::SubMesh_*>_>_>
              ::operator*(&__end2);
    this_02 = *ppSVar2;
    if (this_02 != (SubMesh *)0x0) {
      SubMesh::~SubMesh(this_02);
      operator_delete(this_02,0xa8);
    }
    *ppSVar2 = (SubMesh *)0x0;
    __gnu_cxx::
    __normal_iterator<Assimp::Ogre::SubMesh_**,_std::vector<Assimp::Ogre::SubMesh_*,_std::allocator<Assimp::Ogre::SubMesh_*>_>_>
    ::operator++(&__end2);
  }
  std::vector<Assimp::Ogre::SubMesh_*,_std::allocator<Assimp::Ogre::SubMesh_*>_>::clear
            (&this->subMeshes);
  __end2_1 = std::vector<Assimp::Ogre::Animation_*,_std::allocator<Assimp::Ogre::Animation_*>_>::
             begin(&this->animations);
  anim = (Animation **)
         std::vector<Assimp::Ogre::Animation_*,_std::allocator<Assimp::Ogre::Animation_*>_>::end
                   (&this->animations);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2_1,
                       (__normal_iterator<Assimp::Ogre::Animation_**,_std::vector<Assimp::Ogre::Animation_*,_std::allocator<Assimp::Ogre::Animation_*>_>_>
                        *)&anim);
    if (!bVar1) break;
    ppAVar3 = __gnu_cxx::
              __normal_iterator<Assimp::Ogre::Animation_**,_std::vector<Assimp::Ogre::Animation_*,_std::allocator<Assimp::Ogre::Animation_*>_>_>
              ::operator*(&__end2_1);
    this_03 = *ppAVar3;
    if (this_03 != (Animation *)0x0) {
      Ogre::Animation::~Animation(this_03);
      operator_delete(this_03,0x70);
    }
    *ppAVar3 = (Animation *)0x0;
    __gnu_cxx::
    __normal_iterator<Assimp::Ogre::Animation_**,_std::vector<Assimp::Ogre::Animation_*,_std::allocator<Assimp::Ogre::Animation_*>_>_>
    ::operator++(&__end2_1);
  }
  std::vector<Assimp::Ogre::Animation_*,_std::allocator<Assimp::Ogre::Animation_*>_>::clear
            (&this->animations);
  __end2_2 = std::vector<Assimp::Ogre::Pose_*,_std::allocator<Assimp::Ogre::Pose_*>_>::begin
                       (&this->poses);
  pose = (Pose **)std::vector<Assimp::Ogre::Pose_*,_std::allocator<Assimp::Ogre::Pose_*>_>::end
                            (&this->poses);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2_2,
                       (__normal_iterator<Assimp::Ogre::Pose_**,_std::vector<Assimp::Ogre::Pose_*,_std::allocator<Assimp::Ogre::Pose_*>_>_>
                        *)&pose);
    if (!bVar1) break;
    ppPVar4 = __gnu_cxx::
              __normal_iterator<Assimp::Ogre::Pose_**,_std::vector<Assimp::Ogre::Pose_*,_std::allocator<Assimp::Ogre::Pose_*>_>_>
              ::operator*(&__end2_2);
    this_04 = *ppPVar4;
    if (this_04 != (Pose *)0x0) {
      Pose::~Pose(this_04);
      operator_delete(this_04,0x58);
    }
    *ppPVar4 = (Pose *)0x0;
    __gnu_cxx::
    __normal_iterator<Assimp::Ogre::Pose_**,_std::vector<Assimp::Ogre::Pose_*,_std::allocator<Assimp::Ogre::Pose_*>_>_>
    ::operator++(&__end2_2);
  }
  std::vector<Assimp::Ogre::Pose_*,_std::allocator<Assimp::Ogre::Pose_*>_>::clear(&this->poses);
  return;
}

Assistant:

void Mesh::Reset()
{
    OGRE_SAFE_DELETE(skeleton)
    OGRE_SAFE_DELETE(sharedVertexData)

    for(auto &mesh : subMeshes) {
        OGRE_SAFE_DELETE(mesh)
    }
    subMeshes.clear();
    for(auto &anim : animations) {
        OGRE_SAFE_DELETE(anim)
    }
    animations.clear();
    for(auto &pose : poses) {
        OGRE_SAFE_DELETE(pose)
    }
    poses.clear();
}